

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::LocalsDisplay::CreateWalker(LocalsDisplay *this)

{
  int iVar1;
  undefined4 extraout_var;
  ThreadContext *this_00;
  DebugManager *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  LocalsWalker *this_02;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *this_03;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  LocalsWalker *local_28;
  IDiagObjectModelWalkerBase *pOMWalker;
  ReferencedArenaAdapter *pRefArena;
  LocalsDisplay *this_local;
  
  pRefArena = (ReferencedArenaAdapter *)this;
  iVar1 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  this_00 = ScriptContext::GetThreadContext((ScriptContext *)CONCAT44(extraout_var,iVar1));
  this_01 = ThreadContext::GetDebugManager(this_00);
  pOMWalker = (IDiagObjectModelWalkerBase *)DebugManager::GetDiagnosticArena(this_01);
  if ((ReferencedArenaAdapter *)pOMWalker == (ReferencedArenaAdapter *)0x0) {
    this_local = (LocalsDisplay *)0x0;
  }
  else {
    local_28 = (LocalsWalker *)0x0;
    pAVar2 = &Memory::ReferencedArenaAdapter::Arena((ReferencedArenaAdapter *)pOMWalker)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&LocalsWalker::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xa1);
    pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar2,&local_50);
    local_60 = Memory::ArenaAllocator::Alloc;
    local_58 = 0;
    this_02 = (LocalsWalker *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar2,0x3f67b0);
    LocalsWalker::LocalsWalker(this_02,this->pFrame,1);
    local_28 = this_02;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,
               (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xa3);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_88);
    this_03 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
              new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::WeakArenaReference
              (this_03,(ReferencedArenaAdapter *)pOMWalker,
               &local_28->super_IDiagObjectModelWalkerBase);
    this_local = (LocalsDisplay *)this_03;
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)this_local;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* LocalsDisplay::CreateWalker()
    {
        ReferencedArenaAdapter* pRefArena = pFrame->GetScriptContext()->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase * pOMWalker = nullptr;

            IGNORE_STACKWALK_EXCEPTION(scriptContext);
            pOMWalker = Anew(pRefArena->Arena(), LocalsWalker, pFrame, FrameWalkerFlags::FW_MakeGroups);

            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>,pRefArena, pOMWalker);
        }
        return nullptr;
    }